

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O3

word Abc_SuppFindOne(Vec_Wrd_t *p,int nBits)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong *puVar5;
  ulong uVar6;
  word *pLimit;
  word wVar7;
  int This;
  int local_40;
  int local_3c;
  ulong *local_38;
  
  iVar4 = Abc_SuppGenFindBest(p,nBits,&local_40);
  if (local_40 < 0) {
    wVar7 = 0;
  }
  else {
    local_38 = p->pArray;
    iVar2 = p->nSize;
    puVar1 = local_38 + iVar2;
    wVar7 = 0;
    local_3c = nBits;
    do {
      iVar3 = local_40;
      uVar6 = 1L << ((byte)iVar4 & 0x3f);
      puVar5 = local_38;
      if (0 < iVar2) {
        do {
          if ((*puVar5 & uVar6) != 0) {
            *puVar5 = *puVar5 ^ 1L << ((byte)nBits & 0x3f);
          }
          puVar5 = puVar5 + 1;
        } while (puVar5 < puVar1);
      }
      wVar7 = wVar7 | uVar6;
      iVar4 = Abc_SuppGenFindBest(p,local_3c,&local_40);
    } while (iVar3 < local_40);
  }
  return wVar7;
}

Assistant:

word Abc_SuppFindOne( Vec_Wrd_t * p, int nBits )
{
    word uMask = 0;
    int Prev = -1, This, Var;
    while ( 1 )
    {
        Var = Abc_SuppGenFindBest( p, nBits, &This );
        if ( Prev >= This )
            break;
        Prev = This;
        Abc_SuppGenSelectVar( p, nBits, Var );
        uMask |= (((word)1) << Var);
    }
    return uMask;
}